

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2413.c
# Opt level: O0

void OPLL_set_rate(OPLL *opll,e_uint32 r)

{
  e_uint32 r_local;
  OPLL *opll_local;
  
  rate = r;
  if (opll->quality != 0) {
    rate = 0xc234;
  }
  internal_refresh();
  rate = r;
  return;
}

Assistant:

void
OPLL_set_rate (OPLL * opll, e_uint32 r)
{
  if (opll->quality)
    rate = 49716;
  else
    rate = r;
  internal_refresh ();
  rate = r;
}